

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveShapeFunction.h
# Opt level: O1

void __thiscall
anurbs::NurbsCurveShapeFunction::compute_at_span
          (NurbsCurveShapeFunction *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots,
          Index span,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  PointerType pdVar4;
  Index IVar5;
  Index IVar6;
  double *pdVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  ulong order;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong pole;
  ulong uVar16;
  bool bVar17;
  double dVar18;
  long local_78;
  long local_60;
  
  clear_values(this);
  this->m_first_nonzero_pole = (span - this->m_degree) + 1;
  if (((this->m_ndu).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
       m_rows < 1) ||
     ((this->m_ndu).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
      m_cols < 1)) {
    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x16d,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                 );
  }
  *(this->m_ndu).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       1.0;
  if (0 < this->m_degree) {
    lVar13 = 0;
    do {
      lVar10 = span - lVar13;
      if ((lVar10 < 0) ||
         (lVar14 = (knots->
                   super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                   .m_rows.m_value, lVar14 <= lVar10)) {
LAB_001f3068:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xa2,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator[](Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                     );
      }
      if ((this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar13) goto LAB_001f3049;
      pdVar4 = (knots->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               .m_data;
      (this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [lVar13] = t - pdVar4[lVar10];
      if ((lVar13 + span < -1) || (lVar14 <= lVar13 + span + 1)) goto LAB_001f3068;
      if ((this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar13) goto LAB_001f3049;
      (this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data[lVar13] = pdVar4[lVar13 + span + 1] - t;
      lVar10 = lVar13 + 1;
      dVar18 = 0.0;
      lVar11 = 0;
      lVar14 = lVar13;
      do {
        if (((this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows <= lVar11) ||
           ((this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= lVar14)) goto LAB_001f3049;
        dVar1 = (this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar11];
        dVar2 = (this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar14];
        pdVar7 = ndu(this,lVar10,lVar11);
        *pdVar7 = dVar1 + dVar2;
        pdVar7 = ndu(this,lVar11,lVar13);
        dVar1 = *pdVar7;
        pdVar7 = ndu(this,lVar10,lVar11);
        if ((this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows <= lVar11) goto LAB_001f3049;
        dVar2 = *pdVar7;
        dVar3 = (this->m_right).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar11];
        pdVar7 = ndu(this,lVar11,lVar10);
        *pdVar7 = dVar3 * (dVar1 / dVar2) + dVar18;
        if ((this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= lVar14) goto LAB_001f3049;
        dVar18 = (dVar1 / dVar2) *
                 (this->m_left).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar14];
        lVar11 = lVar11 + 1;
        bVar17 = lVar14 != 0;
        lVar14 = lVar14 + -1;
      } while (bVar17);
      pdVar7 = ndu(this,lVar10,lVar10);
      *pdVar7 = dVar18;
      lVar13 = lVar10;
    } while (lVar10 < this->m_degree);
  }
  lVar13 = this->m_degree;
  if (-1 < lVar13) {
    lVar10 = -1;
    do {
      lVar10 = lVar10 + 1;
      pdVar7 = ndu(this,lVar10,lVar13);
      dVar18 = *pdVar7;
      pdVar7 = value(this,0,lVar10);
      *pdVar7 = dVar18;
      lVar13 = this->m_degree;
    } while (lVar10 < lVar13);
  }
  lVar13 = this->m_degree;
  if (-1 < lVar13) {
    lVar10 = 8;
    local_78 = 1;
    pole = 0;
    do {
      if ((this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows < 1) {
LAB_001f3049:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x198,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      *(this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           1.0;
      if (0 < this->m_order) {
        local_60 = 0;
        uVar16 = 0;
        order = 1;
        do {
          uVar15 = uVar16;
          if (uVar16 < pole) {
            uVar15 = pole;
          }
          uVar8 = uVar16;
          if ((long)uVar16 < (long)pole) {
            uVar8 = pole;
          }
          pdVar7 = value(this,order,pole);
          lVar13 = this->m_degree - order;
          if (order <= pole) {
            if ((this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows < 1) goto LAB_001f3049;
            dVar18 = *(this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data;
            pdVar9 = ndu(this,lVar13 + 1,pole - order);
            if ((this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows < 1) goto LAB_001f3049;
            dVar18 = dVar18 / *pdVar9;
            *(this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data = dVar18;
            pdVar9 = ndu(this,pole - order,lVar13);
            *pdVar7 = dVar18 * *pdVar9;
          }
          lVar14 = order - pole;
          if (order - 1 <= pole) {
            lVar14 = 1;
          }
          lVar11 = lVar13 + 1;
          uVar12 = (this->m_degree - pole) + 1;
          if ((long)pole <= lVar11) {
            uVar12 = order;
          }
          if (lVar14 < (long)uVar12) {
            do {
              if ((((long)(uVar8 + local_78) < 0) ||
                  (lVar14 = local_78 + uVar15,
                  (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows <= lVar14)) || (lVar14 == 0)) goto LAB_001f3049;
              pdVar9 = (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data;
              dVar18 = *(double *)((long)pdVar9 + uVar15 * 8 + lVar10 + -8);
              dVar1 = *(double *)((long)pdVar9 + uVar15 * 8 + lVar10);
              pdVar9 = ndu(this,lVar11,local_60 + uVar15);
              if ((this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows <= lVar14) goto LAB_001f3049;
              dVar18 = (dVar1 - dVar18) / *pdVar9;
              *(double *)
               ((long)(this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data + uVar15 * 8 + lVar10) = dVar18;
              pdVar9 = ndu(this,local_60 + uVar15,lVar13);
              *pdVar7 = dVar18 * *pdVar9 + *pdVar7;
              lVar14 = local_78 + uVar15;
              uVar15 = uVar15 + 1;
            } while (lVar14 + 1 < (long)uVar12);
          }
          if ((long)pole <= lVar13) {
            if ((this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows < (long)order) goto LAB_001f3049;
            dVar18 = (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data[order - 1];
            pdVar9 = ndu(this,lVar11,pole);
            if ((this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                .m_rows <= (long)order) goto LAB_001f3049;
            dVar18 = -dVar18 / *pdVar9;
            (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[order] = dVar18;
            pdVar9 = ndu(this,pole,lVar13);
            *pdVar7 = dVar18 * *pdVar9 + *pdVar7;
          }
          pdVar7 = (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          IVar6 = (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_data = (double *)0x0;
          (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = 0;
          IVar5 = (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_data = (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          (this->m_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = IVar5;
          (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_data = pdVar7;
          (this->m_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows = IVar6;
          uVar16 = uVar16 + 1;
          local_60 = local_60 + -1;
          bVar17 = (long)order < this->m_order;
          order = order + 1;
        } while (bVar17);
      }
      lVar13 = this->m_degree;
      local_78 = local_78 + -1;
      lVar10 = lVar10 + -8;
      bVar17 = (long)pole < lVar13;
      pole = pole + 1;
    } while (bVar17);
  }
  if (0 < this->m_order) {
    lVar10 = 1;
    do {
      lVar14 = this->m_degree;
      if (-1 < lVar14) {
        lVar11 = -1;
        do {
          lVar11 = lVar11 + 1;
          pdVar7 = value(this,lVar10,lVar11);
          *pdVar7 = *pdVar7 * (double)lVar13;
          lVar14 = this->m_degree;
        } while (lVar11 < lVar14);
      }
      lVar13 = lVar13 * (lVar14 - lVar10);
      bVar17 = lVar10 < this->m_order;
      lVar10 = lVar10 + 1;
    } while (bVar17);
  }
  return;
}

Assistant:

void compute_at_span(Eigen::Ref<const Eigen::VectorXd> knots, const Index span, const double t)
    {
        clear_values();

        m_first_nonzero_pole = span - degree() + 1;

        // compute B-Spline shape

        ndu(0, 0) = 1.0;

        for (Index j = 0; j < degree(); j++) {
            m_left[j] = t - knots[span - j];
            m_right[j] = knots[span + j + 1] - t;

            double saved = 0.0;

            for (Index r = 0; r <= j; r++) {
                ndu(j + 1, r) = m_right[r] + m_left[j - r];

                double temp = ndu(r, j) / ndu(j + 1, r);

                ndu(r, j + 1) = saved + m_right[r] * temp;

                saved = m_left[j - r] * temp;
            }

            ndu(j + 1, j + 1) = saved;
        }

        for (Index j = 0; j < nb_nonzero_poles(); j++) {
            value(0, j) = ndu(j, degree());
        }

        auto& a = m_a;
        auto& b = m_b;

        for (Index r = 0; r < nb_nonzero_poles(); r++) {
            a[0] = 1.0;

            for (Index k = 1; k < nb_shapes(); k++) {
                double& v = value(k, r);

                Index rk = r - k;
                Index pk = degree() - k;

                if (r >= k) {
                    b[0] = a[0] / ndu(pk + 1, rk);
                    v = b[0] * ndu(rk, pk);
                }

                Index j1 = r >= k - 1 ? 1 : k - r;
                Index j2 = r <= pk + 1 ? k : nb_nonzero_poles() - r;

                for (Index j = j1; j < j2; j++) {
                    b[j] = (a[j] - a[j - 1]) / ndu(pk + 1, rk + j);
                    v += b[j] * ndu(rk + j, pk);
                }

                if (r <= pk) {
                    b[k] = -a[k - 1] / ndu(pk + 1, r);
                    v += b[k] * ndu(r, pk);
                }

                std::swap(a, b);
            }
        }

        Index s = degree();

        for (Index k = 1; k < nb_shapes(); k++) {
            for (Index j = 0; j < nb_nonzero_poles(); j++) {
                value(k, j) *= s;
            }
            s *= degree() - k;
        }
    }